

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

bool lest::is_number(text *arg)

{
  long lVar1;
  string *in_RDI;
  text digits;
  bool local_79;
  allocator local_49;
  string local_48 [32];
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"0123456789",&local_49);
  std::__cxx11::string::string(local_28,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  lVar1 = std::__cxx11::string::find_first_of(in_RDI,(ulong)local_28);
  local_79 = false;
  if (lVar1 != -1) {
    lVar1 = std::__cxx11::string::find_first_not_of(in_RDI,(ulong)local_28);
    local_79 = lVar1 == -1;
  }
  std::__cxx11::string::~string(local_28);
  return local_79;
}

Assistant:

inline bool is_number( text arg )
{
    const text digits = "0123456789";
    return text::npos != arg.find_first_of    ( digits )
        && text::npos == arg.find_first_not_of( digits );
}